

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  LinkClosure *pLVar3;
  string *li;
  pointer lang;
  
  pLVar3 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  lang = (pLVar3->Languages).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pLVar3->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (lang == pbVar1) {
      return;
    }
    __n = lang->_M_string_length;
    if (__n == (this->LinkLanguage)._M_string_length) {
      if (__n != 0) {
        iVar2 = bcmp((lang->_M_dataplus)._M_p,(this->LinkLanguage)._M_dataplus._M_p,__n);
        if (iVar2 != 0) goto LAB_002ab2a1;
      }
    }
    else {
LAB_002ab2a1:
      AddImplicitLinkInfo(this,lang);
    }
    lang = lang + 1;
  } while( true );
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo()
{
  // The link closure lists all languages whose implicit info is needed.
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for (std::string const& li : lc->Languages) {
    // Skip those of the linker language.  They are implicit.
    if (li != this->LinkLanguage) {
      this->AddImplicitLinkInfo(li);
    }
  }
}